

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O0

void __thiscall ftxui::anon_unknown_0::Border::Render(Border *this,Screen *screen)

{
  bool bVar1;
  __shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  const_reference pvVar4;
  string *psVar5;
  Pixel *pPVar6;
  Pixel *pPVar7;
  size_type sVar8;
  Color *pCVar9;
  int local_50;
  int local_4c;
  int y_1;
  int x_1;
  Pixel *p4;
  Pixel *p3;
  int y;
  Pixel *p2;
  Pixel *p1;
  int x;
  Screen *screen_local;
  Border *this_local;
  
  p_Var2 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ::operator[](&(this->super_Node).children_,0);
  peVar3 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  (*peVar3->_vptr_Node[4])(peVar3,screen);
  if (((this->super_Node).box_.x_min < (this->super_Node).box_.x_max) &&
     ((this->super_Node).box_.y_min < (this->super_Node).box_.y_max)) {
    pvVar4 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
             ::operator[](this->charset_,0);
    psVar5 = Screen::at_abi_cxx11_
                       (screen,(this->super_Node).box_.x_min,(this->super_Node).box_.y_min);
    std::__cxx11::string::operator=((string *)psVar5,(string *)pvVar4);
    pvVar4 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
             ::operator[](this->charset_,1);
    psVar5 = Screen::at_abi_cxx11_
                       (screen,(this->super_Node).box_.x_max,(this->super_Node).box_.y_min);
    std::__cxx11::string::operator=((string *)psVar5,(string *)pvVar4);
    pvVar4 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
             ::operator[](this->charset_,2);
    psVar5 = Screen::at_abi_cxx11_
                       (screen,(this->super_Node).box_.x_min,(this->super_Node).box_.y_max);
    std::__cxx11::string::operator=((string *)psVar5,(string *)pvVar4);
    pvVar4 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
             ::operator[](this->charset_,3);
    psVar5 = Screen::at_abi_cxx11_
                       (screen,(this->super_Node).box_.x_max,(this->super_Node).box_.y_max);
    std::__cxx11::string::operator=((string *)psVar5,(string *)pvVar4);
    p1._4_4_ = (this->super_Node).box_.x_min;
    while (p1._4_4_ = p1._4_4_ + 1, p1._4_4_ < (this->super_Node).box_.x_max) {
      pPVar6 = Screen::PixelAt(screen,p1._4_4_,(this->super_Node).box_.y_min);
      pPVar7 = Screen::PixelAt(screen,p1._4_4_,(this->super_Node).box_.y_max);
      pvVar4 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
               ::operator[](this->charset_,4);
      std::__cxx11::string::operator=((string *)&pPVar6->character,(string *)pvVar4);
      pvVar4 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
               ::operator[](this->charset_,4);
      std::__cxx11::string::operator=((string *)&pPVar7->character,(string *)pvVar4);
      *(byte *)pPVar6 = *(byte *)pPVar6 & 0x7f | 0x80;
      *(byte *)pPVar7 = *(byte *)pPVar7 & 0x7f | 0x80;
    }
    p3._4_4_ = (this->super_Node).box_.y_min;
    while (p3._4_4_ = p3._4_4_ + 1, p3._4_4_ < (this->super_Node).box_.y_max) {
      pPVar6 = Screen::PixelAt(screen,(this->super_Node).box_.x_min,p3._4_4_);
      pPVar7 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,p3._4_4_);
      pvVar4 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
               ::operator[](this->charset_,5);
      std::__cxx11::string::operator=((string *)&pPVar6->character,(string *)pvVar4);
      pvVar4 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
               ::operator[](this->charset_,5);
      std::__cxx11::string::operator=((string *)&pPVar7->character,(string *)pvVar4);
      *(byte *)pPVar6 = *(byte *)pPVar6 & 0x7f | 0x80;
      *(byte *)pPVar7 = *(byte *)pPVar7 & 0x7f | 0x80;
    }
    sVar8 = std::
            vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
            size(&(this->super_Node).children_);
    if (sVar8 == 2) {
      p_Var2 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::
               vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
               ::operator[](&(this->super_Node).children_,1);
      peVar3 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var2);
      (*peVar3->_vptr_Node[4])(peVar3,screen);
    }
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->foreground_color_);
    if (bVar1) {
      for (local_4c = (this->super_Node).box_.x_min; local_4c <= (this->super_Node).box_.x_max;
          local_4c = local_4c + 1) {
        pCVar9 = std::optional<ftxui::Color>::operator*(&this->foreground_color_);
        pPVar6 = Screen::PixelAt(screen,local_4c,(this->super_Node).box_.y_min);
        pPVar6->foreground_color = *pCVar9;
        pCVar9 = std::optional<ftxui::Color>::operator*(&this->foreground_color_);
        pPVar6 = Screen::PixelAt(screen,local_4c,(this->super_Node).box_.y_max);
        pPVar6->foreground_color = *pCVar9;
      }
      for (local_50 = (this->super_Node).box_.y_min; local_50 <= (this->super_Node).box_.y_max;
          local_50 = local_50 + 1) {
        pCVar9 = std::optional<ftxui::Color>::operator*(&this->foreground_color_);
        pPVar6 = Screen::PixelAt(screen,(this->super_Node).box_.x_min,local_50);
        pPVar6->foreground_color = *pCVar9;
        pCVar9 = std::optional<ftxui::Color>::operator*(&this->foreground_color_);
        pPVar6 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,local_50);
        pPVar6->foreground_color = *pCVar9;
      }
    }
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    // Draw content.
    children_[0]->Render(screen);

    // Draw the border.
    if (box_.x_min >= box_.x_max || box_.y_min >= box_.y_max) {
      return;
    }

    screen.at(box_.x_min, box_.y_min) = charset_[0];  // NOLINT
    screen.at(box_.x_max, box_.y_min) = charset_[1];  // NOLINT
    screen.at(box_.x_min, box_.y_max) = charset_[2];  // NOLINT
    screen.at(box_.x_max, box_.y_max) = charset_[3];  // NOLINT

    for (int x = box_.x_min + 1; x < box_.x_max; ++x) {
      Pixel& p1 = screen.PixelAt(x, box_.y_min);
      Pixel& p2 = screen.PixelAt(x, box_.y_max);
      p1.character = charset_[4];  // NOLINT
      p2.character = charset_[4];  // NOLINT
      p1.automerge = true;
      p2.automerge = true;
    }
    for (int y = box_.y_min + 1; y < box_.y_max; ++y) {
      Pixel& p3 = screen.PixelAt(box_.x_min, y);
      Pixel& p4 = screen.PixelAt(box_.x_max, y);
      p3.character = charset_[5];  // NOLINT
      p4.character = charset_[5];  // NOLINT
      p3.automerge = true;
      p4.automerge = true;
    }

    // Draw title.
    if (children_.size() == 2) {
      children_[1]->Render(screen);
    }

    // Draw the border color.
    if (foreground_color_) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, box_.y_min).foreground_color = *foreground_color_;
        screen.PixelAt(x, box_.y_max).foreground_color = *foreground_color_;
      }
      for (int y = box_.y_min; y <= box_.y_max; ++y) {
        screen.PixelAt(box_.x_min, y).foreground_color = *foreground_color_;
        screen.PixelAt(box_.x_max, y).foreground_color = *foreground_color_;
      }
    }
  }